

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.hpp
# Opt level: O1

bool helics::
     addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
               (json *section,string *targetName,anon_class_8_1_36d583d8 callback)

{
  value_t vVar1;
  Core *pCVar2;
  bool bVar3;
  iterator iVar4;
  const_reference pvVar5;
  reference pbVar6;
  iterator __begin4;
  value_type targets;
  iterator __end4;
  undefined1 local_a0 [24];
  primitive_iterator_t local_88;
  data local_80;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_70;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  if (((section->m_data).m_type == object) &&
     (iVar4 = CLI::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
              ::find(&((section->m_data).m_value.object)->_M_t,(key_type *)targetName),
     (_Rb_tree_header *)iVar4._M_node !=
     &(((section->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar5 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](section,(key_type *)targetName);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_80,pvVar5);
    if (local_80.m_type == array) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::begin((iterator *)local_a0,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)&local_80);
      local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_70.m_it.array_iterator._M_current = (pointer)0x0;
      local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      if (local_80.m_type == array) {
        local_70.m_it.array_iterator._M_current =
             ((local_80.m_value.array)->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (local_80.m_type == object) {
        local_70.m_it.object_iterator._M_node =
             &((local_80.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        local_70.m_it.primitive_iterator.m_it = 1;
      }
      local_70.m_object = (pointer)&local_80;
      while (bVar3 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_a0,&local_70), !bVar3) {
        pbVar6 = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)local_a0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_50,pbVar6);
        pCVar2 = ((callback.translator)->super_Interface).mCore;
        (*pCVar2->_vptr_Core[0x3e])
                  (pCVar2,(ulong)(uint)((callback.translator)->super_Interface).handle.hid,local_48,
                   local_50,0x65);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        vVar1 = ((data *)local_a0._0_8_)->m_type;
        if (vVar1 == array) {
          local_a0._16_8_ = local_a0._16_8_ + 0x10;
        }
        else if (vVar1 == object) {
          local_a0._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_a0._8_8_);
        }
        else {
          local_88.m_it = local_88.m_it + 1;
        }
      }
    }
    else {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_a0,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)&local_80);
      pCVar2 = ((callback.translator)->super_Interface).mCore;
      (*pCVar2->_vptr_Core[0x3e])
                (pCVar2,(ulong)(uint)((callback.translator)->super_Interface).handle.hid,
                 local_a0._8_8_,local_a0._0_8_,0x65);
      if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_,(ulong)&((data *)local_a0._16_8_)->field_0x1);
      }
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_80);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  if ((((targetName->_M_dataplus)._M_p[targetName->_M_string_length - 1] == 's') &&
      (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
       pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)targetName),
      (section->m_data).m_type == object)) &&
     (iVar4 = CLI::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
              ::find(&((section->m_data).m_value.object)->_M_t,(key_type *)targetName),
     (_Rb_tree_header *)iVar4._M_node !=
     &(((section->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar5 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](section,(key_type *)targetName);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_a0,pvVar5);
    pCVar2 = ((callback.translator)->super_Interface).mCore;
    (*pCVar2->_vptr_Core[0x3e])
              (pCVar2,(ulong)(uint)((callback.translator)->super_Interface).handle.hid,
               local_a0._8_8_,local_a0._0_8_,0x65);
    if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,(ulong)&((data *)local_a0._16_8_)->field_0x1);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool addTargets(const nlohmann::json& section, std::string targetName, Callable callback)
{
    bool found{false};
    // There should probably be a static_assert here but there isn't a nice type trait to check that
    if (section.contains(targetName)) {
        auto targets = section[targetName];
        if (targets.is_array()) {
            for (const auto& target : targets) {
                callback(target.get<std::string>());
            }
        } else {
            callback(targets.get<std::string>());
        }
        found = true;
    }
    if (targetName.back() == 's') {
        targetName.pop_back();
        if (section.contains(targetName)) {
            callback(section[targetName].get<std::string>());
            found = true;
        }
    }
    return found;
}